

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

void __thiscall
Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult
          (BasicResult<Catch::Clara::Detail::ParseState> *this,ResultType type,string *message)

{
  pointer pcVar1;
  
  (this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase.m_type = type;
  (this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase._vptr_ResultBase
       = (_func_int **)&PTR__BasicResult_001bced0;
  (this->m_errorMessage)._M_dataplus._M_p = (pointer)&(this->m_errorMessage).field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_errorMessage,pcVar1,pcVar1 + message->_M_string_length);
  if ((this->super_ResultValueBase<Catch::Clara::Detail::ParseState>).super_ResultBase.m_type != Ok)
  {
    return;
  }
  __assert_fail("m_type != ResultType::Ok",
                "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.hpp"
                ,0x10cd,
                "Catch::Clara::Detail::BasicResult<Catch::Clara::Detail::ParseState>::BasicResult(ResultType, const std::string &) [T = Catch::Clara::Detail::ParseState]"
               );
}

Assistant:

BasicResult( ResultType type,
                             std::string const& message ):
                    ResultValueBase<T>( type ), m_errorMessage( message ) {
                    assert( m_type != ResultType::Ok );
                }